

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O3

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  float *pfVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float *ptr;
  int iVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar19;
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  
  iVar6 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar3 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  if (iVar9 == 3) {
    uVar7 = bottom_top_blob->c;
    if (0 < (int)uVar7) {
      uVar8 = iVar3 * iVar6 * uVar8;
      uVar12 = 0;
      do {
        pfVar4 = (float *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          fVar16 = *pfVar4;
          fVar17 = fVar16;
          fVar19 = fVar16;
          fVar20 = fVar16;
          fVar21 = fVar16;
        }
        else {
          fVar16 = pfVar4[uVar12];
          fVar17 = fVar16;
          fVar19 = fVar16;
          fVar20 = fVar16;
          fVar21 = fVar16;
          if (iVar6 == 4) {
            pfVar4 = pfVar4 + uVar12 * 4;
            fVar17 = *pfVar4;
            fVar19 = pfVar4[1];
            fVar20 = pfVar4[2];
            fVar21 = pfVar4[3];
          }
        }
        pauVar14 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar8) {
          iVar9 = 3;
          do {
            auVar18 = maxps(*pauVar14,ZEXT816(0));
            auVar15 = minps(*pauVar14,ZEXT816(0));
            *(float *)*pauVar14 = auVar15._0_4_ * fVar17 + auVar18._0_4_;
            *(float *)(*pauVar14 + 4) = auVar15._4_4_ * fVar19 + auVar18._4_4_;
            *(float *)(*pauVar14 + 8) = auVar15._8_4_ * fVar20 + auVar18._8_4_;
            *(float *)(*pauVar14 + 0xc) = auVar15._12_4_ * fVar21 + auVar18._12_4_;
            pauVar14 = pauVar14 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar8 & 0xfffffffc;
          } while (iVar9 < (int)uVar8);
        }
        if (uVar8 - uVar10 != 0 && (int)uVar10 <= (int)uVar8) {
          lVar13 = 0;
          do {
            if (*(float *)(*pauVar14 + lVar13 * 4) < 0.0) {
              *(float *)(*pauVar14 + lVar13 * 4) = *(float *)(*pauVar14 + lVar13 * 4) * fVar16;
            }
            lVar13 = lVar13 + 1;
          } while (uVar8 - uVar10 != (int)lVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar7);
    }
  }
  else if (iVar9 == 2) {
    if (0 < (int)uVar8) {
      uVar7 = iVar3 * iVar6;
      uVar12 = 0;
      do {
        pfVar4 = (float *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          fVar16 = *pfVar4;
          fVar17 = fVar16;
          fVar19 = fVar16;
          fVar20 = fVar16;
          fVar21 = fVar16;
        }
        else {
          fVar16 = pfVar4[uVar12];
          fVar17 = fVar16;
          fVar19 = fVar16;
          fVar20 = fVar16;
          fVar21 = fVar16;
          if (iVar6 == 4) {
            pfVar4 = pfVar4 + uVar12 * 4;
            fVar17 = *pfVar4;
            fVar19 = pfVar4[1];
            fVar20 = pfVar4[2];
            fVar21 = pfVar4[3];
          }
        }
        pauVar14 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar7) {
          iVar9 = 3;
          do {
            auVar18 = maxps(*pauVar14,ZEXT816(0));
            auVar15 = minps(*pauVar14,ZEXT816(0));
            *(float *)*pauVar14 = auVar15._0_4_ * fVar17 + auVar18._0_4_;
            *(float *)(*pauVar14 + 4) = auVar15._4_4_ * fVar19 + auVar18._4_4_;
            *(float *)(*pauVar14 + 8) = auVar15._8_4_ * fVar20 + auVar18._8_4_;
            *(float *)(*pauVar14 + 0xc) = auVar15._12_4_ * fVar21 + auVar18._12_4_;
            pauVar14 = pauVar14 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar7 & 0xfffffffc;
          } while (iVar9 < (int)uVar7);
        }
        if (uVar7 - uVar10 != 0 && (int)uVar10 <= (int)uVar7) {
          lVar13 = 0;
          do {
            if (*(float *)(*pauVar14 + lVar13 * 4) < 0.0) {
              *(float *)(*pauVar14 + lVar13 * 4) = *(float *)(*pauVar14 + lVar13 * 4) * fVar16;
            }
            lVar13 = lVar13 + 1;
          } while (uVar7 - uVar10 != (int)lVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar8);
    }
  }
  else if (iVar9 == 1) {
    iVar6 = iVar6 * iVar3;
    pauVar14 = (undefined1 (*) [16])bottom_top_blob->data;
    pfVar4 = (float *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      fVar16 = *pfVar4;
      iVar9 = iVar6 + 3;
      if (-1 < iVar6) {
        iVar9 = iVar6;
      }
      if (3 < iVar6) {
        uVar12 = (ulong)(uint)(iVar9 >> 2);
        pauVar11 = pauVar14;
        do {
          auVar18 = maxps(*pauVar11,ZEXT816(0));
          auVar15 = minps(*pauVar11,ZEXT816(0));
          *(float *)*pauVar11 = auVar15._0_4_ * fVar16 + auVar18._0_4_;
          *(float *)(*pauVar11 + 4) = auVar15._4_4_ * fVar16 + auVar18._4_4_;
          *(float *)(*pauVar11 + 8) = auVar15._8_4_ * fVar16 + auVar18._8_4_;
          *(float *)(*pauVar11 + 0xc) = auVar15._12_4_ * fVar16 + auVar18._12_4_;
          pauVar11 = pauVar11 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar9 = (iVar9 >> 2) << 2;
      if (iVar9 < iVar6) {
        lVar13 = (long)iVar9;
        do {
          if (*(float *)(*pauVar14 + lVar13 * 4) < 0.0) {
            *(float *)(*pauVar14 + lVar13 * 4) = *(float *)(*pauVar14 + lVar13 * 4) * fVar16;
          }
          lVar13 = lVar13 + 1;
        } while (iVar6 != lVar13);
      }
    }
    else {
      iVar9 = iVar6 + 3;
      if (-1 < iVar6) {
        iVar9 = iVar6;
      }
      if (3 < iVar6) {
        uVar12 = (ulong)(uint)(iVar9 >> 2);
        lVar13 = 0;
        do {
          pfVar1 = (float *)((long)pfVar4 + lVar13);
          fVar16 = pfVar1[1];
          fVar17 = pfVar1[2];
          fVar19 = pfVar1[3];
          auVar18 = maxps(*(undefined1 (*) [16])(*pauVar14 + lVar13),ZEXT816(0));
          auVar15 = minps(*(undefined1 (*) [16])(*pauVar14 + lVar13),ZEXT816(0));
          pfVar2 = (float *)(*pauVar14 + lVar13);
          *pfVar2 = auVar15._0_4_ * *pfVar1 + auVar18._0_4_;
          pfVar2[1] = auVar15._4_4_ * fVar16 + auVar18._4_4_;
          pfVar2[2] = auVar15._8_4_ * fVar17 + auVar18._8_4_;
          pfVar2[3] = auVar15._12_4_ * fVar19 + auVar18._12_4_;
          lVar13 = lVar13 + 0x10;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar9 = (iVar9 >> 2) << 2;
      if (iVar9 < iVar6) {
        pvVar5 = (this->super_PReLU).slope_data.data;
        lVar13 = (long)iVar9;
        do {
          if (*(float *)(*pauVar14 + lVar13 * 4) < 0.0) {
            *(float *)(*pauVar14 + lVar13 * 4) =
                 *(float *)(*pauVar14 + lVar13 * 4) * *(float *)((long)pvVar5 + lVar13 * 4);
          }
          lVar13 = lVar13 + 1;
        } while (iVar6 != lVar13);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}